

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_bool(yajl_gen g,int boolean)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  yajl_gen_state yVar3;
  size_t sVar4;
  char *pcVar5;
  uint _i;
  uint uVar6;
  char *pcVar7;
  
  pcVar7 = "true";
  if (boolean == 0) {
    pcVar7 = "false";
  }
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar5 = " ";
LAB_001055ae:
      (*g->print)(g->ctx,pcVar5,1);
    }
    break;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) != 0) {
      pcVar5 = "\n";
      goto LAB_001055ae;
    }
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  if (((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val && (ulong)g->depth != 0)) {
    uVar6 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar5 = g->indentString;
      sVar4 = strlen(pcVar5);
      (*p_Var1)(pvVar2,pcVar5,sVar4 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while (uVar6 < g->depth);
  }
  (*g->print)(g->ctx,pcVar7,SUB18(boolean == 0,0) + 4);
  uVar6 = g->depth;
  yVar3 = g->state[uVar6];
  switch(yVar3) {
  case yajl_gen_start:
    g->state[uVar6] = yajl_gen_complete;
    if ((g->flags & 1) == 0) {
      return yajl_gen_status_ok;
    }
    goto LAB_0010567f;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar3 = yajl_gen_map_val;
    break;
  case yajl_gen_map_val:
    yVar3 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar3 = yajl_gen_in_array;
    break;
  default:
    goto switchD_00105642_default;
  }
  g->state[uVar6] = yVar3;
switchD_00105642_default:
  if (((g->flags & 1) != 0) && (yVar3 == yajl_gen_complete)) {
LAB_0010567f:
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_bool(yajl_gen g, int boolean)
{
    const char * val = boolean ? "true" : "false";

	ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, val, (unsigned int)strlen(val));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}